

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

complex<double> __thiscall
CGL::PathTracer::compute_phase(PathTracer *this,int flare,double u,double v,Vector2D *screen_pos)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  complex<double> cVar11;
  double ud;
  double lr;
  Vector2D *fo;
  Vector2D local_60;
  double local_50;
  double local_48;
  reference local_40;
  double *local_38;
  
  local_38 = in_RDX;
  local_40 = std::vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>::operator[]
                       ((vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *)(in_RDI + 0x100),
                        (long)in_ESI);
  auVar2 = _DAT_001382b0;
  auVar1 = _DAT_001382a0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_40->x;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(in_RDI + 0xa0);
  auVar5 = vpunpckldq_avx(auVar7,_DAT_001382a0);
  auVar5 = vsubpd_avx(auVar5,_DAT_001382b0);
  auVar6 = vpermilpd_avx(auVar5,1);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_40->x * (auVar6._0_8_ + auVar5._0_8_);
  auVar5 = vroundsd_avx(auVar3,auVar8,10);
  local_48 = auVar5._0_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_40->y;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(in_RDI + 0xa8);
  auVar5 = vpunpckldq_avx(auVar9,_DAT_001382a0);
  auVar5 = vsubpd_avx(auVar5,_DAT_001382b0);
  auVar6 = vpermilpd_avx(auVar5,1);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_40->y * (auVar6._0_8_ + auVar5._0_8_);
  auVar5 = vroundsd_avx(auVar4,auVar10,10);
  local_50 = auVar5._0_8_;
  Vector2D::Vector2D(&local_60,local_48,local_50);
  *local_38 = local_60.x;
  local_38[1] = local_60.y;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(in_RDI + 0xa0);
  auVar5 = vpunpckldq_avx(auVar5,auVar1);
  auVar5 = vsubpd_avx(auVar5,auVar2);
  auVar6 = vpermilpd_avx(auVar5,1);
  local_48 = local_48 + (auVar6._0_8_ + auVar5._0_8_) * -0.5;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(in_RDI + 0xa8);
  auVar5 = vpunpckldq_avx(auVar6,auVar1);
  auVar5 = vsubpd_avx(auVar5,auVar2);
  auVar6 = vpermilpd_avx(auVar5,1);
  local_50 = (auVar6._0_8_ + auVar5._0_8_) * 0.5 - local_50;
  cVar11 = complex_exp(auVar1._8_8_,auVar1[7]);
  return (complex<double>)cVar11._M_value;
}

Assistant:

std::complex<double> PathTracer::compute_phase(int flare, double u, double v, Vector2D& screen_pos) {
  Vector2D& fo = flare_origins[flare];

  // convert [0, 1] x [0, 1] to [0, width] x [0, height]
  auto lr = (double) (ceil(fo.x * (double)sampleBuffer.w));
  auto ud = (double) (ceil(fo.y * (double)sampleBuffer.h));
  screen_pos = Vector2D(lr, ud);

  // convert [0, width] x [0, height] to [-width / 2, width / 2] x [-height / 2, height / 2]
  // smaller heights are higher up
  lr -= (double)sampleBuffer.w / 2.0;
  ud = -ud + (double)sampleBuffer.h / 2.0;

  return complex_exp(u * lr + v * ud, false);
}